

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void ImGui::Render(void)

{
  ImVector<ImGuiViewportP_*> *this;
  int *piVar1;
  uint uVar2;
  ImGuiViewportP *pIVar3;
  ImGuiWindow *window;
  ImVec2 IVar4;
  ImGuiContext *ctx;
  ImGuiWindow *pIVar5;
  int iVar6;
  ImGuiViewportP **ppIVar7;
  ImDrawList *pIVar8;
  ImGuiWindow **ppIVar9;
  ImGuiIO *pIVar10;
  int iVar11;
  ImDrawList **ppIVar12;
  int n;
  int iVar13;
  ulong uVar14;
  ImGuiWindow *pIVar15;
  int n_2;
  long lVar16;
  ImGuiWindow *windows_to_render_top_most [2];
  
  ctx = GImGui;
  if (GImGui->Initialized != false) {
    iVar13 = GImGui->FrameCountEnded;
    if (iVar13 != GImGui->FrameCount) {
      EndFrame();
      iVar13 = ctx->FrameCount;
    }
    ctx->FrameCountRendered = iVar13;
    (ctx->IO).MetricsRenderWindows = 0;
    CallContextHooks(ctx,ImGuiContextHookType_RenderPre);
    this = &ctx->Viewports;
    for (iVar13 = 0; iVar13 != this->Size; iVar13 = iVar13 + 1) {
      ppIVar7 = ImVector<ImGuiViewportP_*>::operator[](this,iVar13);
      pIVar3 = *ppIVar7;
      ImDrawDataBuilder::Clear(&pIVar3->DrawDataBuilder);
      if (pIVar3->DrawLists[0] != (ImDrawList *)0x0) {
        pIVar8 = GetBackgroundDrawList(&pIVar3->super_ImGuiViewport);
        AddDrawListToDrawData((pIVar3->DrawDataBuilder).Layers,pIVar8);
      }
    }
    pIVar15 = ctx->NavWindowingTarget;
    if (pIVar15 == (ImGuiWindow *)0x0) {
      windows_to_render_top_most[0] = (ImGuiWindow *)0x0;
      pIVar15 = (ImGuiWindow *)0x0;
    }
    else {
      if ((pIVar15->Flags & 0x2000) == 0) {
        windows_to_render_top_most[0] = pIVar15->RootWindow;
      }
      else {
        windows_to_render_top_most[0] = (ImGuiWindow *)0x0;
      }
      pIVar15 = ctx->NavWindowingListWindow;
    }
    pIVar5 = windows_to_render_top_most[0];
    windows_to_render_top_most[1] = pIVar15;
    for (iVar13 = 0; iVar13 != (ctx->Windows).Size; iVar13 = iVar13 + 1) {
      ppIVar9 = ImVector<ImGuiWindow_*>::operator[](&ctx->Windows,iVar13);
      window = *ppIVar9;
      if (((window->Active == true) && (window->Hidden == false)) &&
         ((window != pIVar15 && window != pIVar5) && (window->Flags & 0x1000000) == 0)) {
        AddRootWindowToDrawData(window);
      }
    }
    for (lVar16 = 0; lVar16 != 2; lVar16 = lVar16 + 1) {
      pIVar15 = windows_to_render_top_most[lVar16];
      if (((pIVar15 != (ImGuiWindow *)0x0) && (pIVar15->Active == true)) &&
         (pIVar15->Hidden == false)) {
        AddRootWindowToDrawData(pIVar15);
      }
    }
    (ctx->IO).MetricsRenderVertices = 0;
    (ctx->IO).MetricsRenderIndices = 0;
    for (iVar13 = 0; iVar13 < this->Size; iVar13 = iVar13 + 1) {
      ppIVar7 = ImVector<ImGuiViewportP_*>::operator[](this,iVar13);
      pIVar3 = *ppIVar7;
      ImDrawDataBuilder::FlattenIntoSingleLayer(&pIVar3->DrawDataBuilder);
      if ((ctx->IO).MouseDrawCursor == true) {
        pIVar8 = GetForegroundDrawList(&pIVar3->super_ImGuiViewport);
        RenderMouseCursor(pIVar8,(ctx->IO).MousePos,(ctx->Style).MouseCursorScale,ctx->MouseCursor,
                          0xffffffff,0xff000000,0x30000000);
      }
      if (pIVar3->DrawLists[1] != (ImDrawList *)0x0) {
        pIVar8 = GetForegroundDrawList(&pIVar3->super_ImGuiViewport);
        AddDrawListToDrawData((pIVar3->DrawDataBuilder).Layers,pIVar8);
      }
      pIVar10 = GetIO();
      (pIVar3->DrawDataP).Valid = true;
      uVar2 = (pIVar3->DrawDataBuilder).Layers[0].Size;
      if ((int)uVar2 < 1) {
        ppIVar12 = (ImDrawList **)0x0;
      }
      else {
        ppIVar12 = (pIVar3->DrawDataBuilder).Layers[0].Data;
      }
      (pIVar3->DrawDataP).CmdLists = ppIVar12;
      (pIVar3->DrawDataP).CmdListsCount = uVar2;
      (pIVar3->DrawDataP).TotalIdxCount = 0;
      (pIVar3->DrawDataP).TotalVtxCount = 0;
      IVar4 = (pIVar3->super_ImGuiViewport).Size;
      (pIVar3->DrawDataP).DisplayPos = (pIVar3->super_ImGuiViewport).Pos;
      (pIVar3->DrawDataP).DisplaySize = IVar4;
      (pIVar3->DrawDataP).FramebufferScale = pIVar10->DisplayFramebufferScale;
      iVar6 = 0;
      if ((int)uVar2 < 1) {
        uVar2 = 0;
      }
      iVar11 = 0;
      for (uVar14 = 0; uVar2 != uVar14; uVar14 = uVar14 + 1) {
        pIVar8 = (pIVar3->DrawDataBuilder).Layers[0].Data[uVar14];
        iVar11 = iVar11 + (pIVar8->VtxBuffer).Size;
        (pIVar3->DrawDataP).TotalVtxCount = iVar11;
        iVar6 = iVar6 + (pIVar8->IdxBuffer).Size;
        (pIVar3->DrawDataP).TotalIdxCount = iVar6;
      }
      piVar1 = &(ctx->IO).MetricsRenderVertices;
      *piVar1 = *piVar1 + iVar11;
      piVar1 = &(ctx->IO).MetricsRenderIndices;
      *piVar1 = *piVar1 + iVar6;
    }
    CallContextHooks(ctx,ImGuiContextHookType_RenderPost);
    return;
  }
  __assert_fail("g.Initialized",
                "/workspace/llm4binary/github/license_all_cmakelists_25/aatifjiwani[P]lens-flare/src/imgui/imgui.cpp"
                ,0x1131,"void ImGui::Render()");
}

Assistant:

void ImGui::Render()
{
    ImGuiContext& g = *GImGui;
    IM_ASSERT(g.Initialized);

    if (g.FrameCountEnded != g.FrameCount)
        EndFrame();
    g.FrameCountRendered = g.FrameCount;
    g.IO.MetricsRenderWindows = 0;

    CallContextHooks(&g, ImGuiContextHookType_RenderPre);

    // Add background ImDrawList (for each active viewport)
    for (int n = 0; n != g.Viewports.Size; n++)
    {
        ImGuiViewportP* viewport = g.Viewports[n];
        viewport->DrawDataBuilder.Clear();
        if (viewport->DrawLists[0] != NULL)
            AddDrawListToDrawData(&viewport->DrawDataBuilder.Layers[0], GetBackgroundDrawList(viewport));
    }

    // Add ImDrawList to render
    ImGuiWindow* windows_to_render_top_most[2];
    windows_to_render_top_most[0] = (g.NavWindowingTarget && !(g.NavWindowingTarget->Flags & ImGuiWindowFlags_NoBringToFrontOnFocus)) ? g.NavWindowingTarget->RootWindow : NULL;
    windows_to_render_top_most[1] = (g.NavWindowingTarget ? g.NavWindowingListWindow : NULL);
    for (int n = 0; n != g.Windows.Size; n++)
    {
        ImGuiWindow* window = g.Windows[n];
        if (IsWindowActiveAndVisible(window) && (window->Flags & ImGuiWindowFlags_ChildWindow) == 0 && window != windows_to_render_top_most[0] && window != windows_to_render_top_most[1])
            AddRootWindowToDrawData(window);
    }
    for (int n = 0; n < IM_ARRAYSIZE(windows_to_render_top_most); n++)
        if (windows_to_render_top_most[n] && IsWindowActiveAndVisible(windows_to_render_top_most[n])) // NavWindowingTarget is always temporarily displayed as the top-most window
            AddRootWindowToDrawData(windows_to_render_top_most[n]);

    // Setup ImDrawData structures for end-user
    g.IO.MetricsRenderVertices = g.IO.MetricsRenderIndices = 0;
    for (int n = 0; n < g.Viewports.Size; n++)
    {
        ImGuiViewportP* viewport = g.Viewports[n];
        viewport->DrawDataBuilder.FlattenIntoSingleLayer();

        // Draw software mouse cursor if requested by io.MouseDrawCursor flag
        if (g.IO.MouseDrawCursor)
            RenderMouseCursor(GetForegroundDrawList(viewport), g.IO.MousePos, g.Style.MouseCursorScale, g.MouseCursor, IM_COL32_WHITE, IM_COL32_BLACK, IM_COL32(0, 0, 0, 48));

        // Add foreground ImDrawList (for each active viewport)
        if (viewport->DrawLists[1] != NULL)
            AddDrawListToDrawData(&viewport->DrawDataBuilder.Layers[0], GetForegroundDrawList(viewport));

        SetupViewportDrawData(viewport, &viewport->DrawDataBuilder.Layers[0]);
        ImDrawData* draw_data = &viewport->DrawDataP;
        g.IO.MetricsRenderVertices += draw_data->TotalVtxCount;
        g.IO.MetricsRenderIndices += draw_data->TotalIdxCount;
    }

    CallContextHooks(&g, ImGuiContextHookType_RenderPost);
}